

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

string * EncodeExtKey_abi_cxx11_(CExtKey *key)

{
  CExtKey *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> in_stack_00000010;
  size_t size;
  string *ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  Base58Type in_stack_ffffffffffffff74;
  CChainParams *in_stack_ffffffffffffff78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uchar *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Params();
  CChainParams::Base58Prefix(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,
             in_stack_ffffffffffffffb8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffff68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(in_stack_ffffffffffffff68);
  CExtKey::Encode(in_RSI,in_stack_ffffffffffffff80);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff78,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  EncodeBase58Check_abi_cxx11_(in_stack_00000010);
  this = &local_20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(in_stack_ffffffffffffff68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffff68);
  memory_cleanse(in_stack_ffffffffffffff68,0x1f43e1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string EncodeExtKey(const CExtKey& key)
{
    std::vector<unsigned char> data = Params().Base58Prefix(CChainParams::EXT_SECRET_KEY);
    size_t size = data.size();
    data.resize(size + BIP32_EXTKEY_SIZE);
    key.Encode(data.data() + size);
    std::string ret = EncodeBase58Check(data);
    memory_cleanse(data.data(), data.size());
    return ret;
}